

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O3

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<4>::
DecodeInternal<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
          (DynamicIntegerPointsKdTreeDecoder<4> *this,uint32_t num_points,
          ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
          *oit)

{
  uint *puVar1;
  int *piVar2;
  uint32_t uVar3;
  pointer pvVar4;
  void *pvVar5;
  DecodingStatus *pDVar6;
  uint32_t *puVar7;
  bool bVar8;
  uint32_t uVar9;
  ulong *puVar10;
  uint32_t uVar11;
  _Elt_pointer pDVar12;
  ulong uVar13;
  pointer puVar14;
  RAnsBitDecoder *this_00;
  uint32_t result;
  int iVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  VectorUint32 *levels;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>_>
  status_stack;
  DecodingStatus local_e8;
  uint32_t local_dc;
  long local_d8;
  DecodingStatus local_cc;
  ulong local_c0;
  ulong local_b8;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *local_b0;
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
  local_a8;
  ulong local_50;
  RAnsBitDecoder *local_48;
  ulong local_40;
  DirectBitDecoder *local_38;
  
  local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
  local_dc = num_points;
  local_b0 = oit;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_e8.num_remaining_points,(allocator_type *)&local_cc);
  pvVar4 = (this->base_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar14 = *(pointer *)
             ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_a8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_a8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_a8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar5 != (void *)0x0) &&
     (operator_delete(pvVar5,(long)puVar14 - (long)pvVar5),
     local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_e8.num_remaining_points,(allocator_type *)&local_cc);
  pvVar4 = (this->levels_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar14 = *(pointer *)
             ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_a8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_a8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_a8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar5 != (void *)0x0) &&
     (operator_delete(pvVar5,(long)puVar14 - (long)pvVar5),
     local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_cc.num_remaining_points = local_dc;
  local_cc.last_axis = 0;
  local_cc.stack_pos = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
  ::_M_initialize_map(&local_a8,0);
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>>
    ::_M_push_back_aux<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus_const&>
              ((deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>>
                *)&local_a8,&local_cc);
  }
  else {
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos = local_cc.stack_pos;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_cc.num_remaining_points;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_cc.last_axis;
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  bVar8 = true;
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_48 = (RAnsBitDecoder *)&this->numbers_decoder_;
    local_38 = &this->remaining_bits_decoder_;
    do {
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pDVar6 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        uVar21 = pDVar6[0x29].num_remaining_points;
        uVar9 = pDVar6[0x29].last_axis;
        uVar17 = pDVar6[0x29].stack_pos;
        operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x1f8);
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x2a;
        pDVar12 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x29;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        pDVar12 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        uVar21 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].num_remaining_points;
        uVar9 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].last_axis;
        uVar17 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].stack_pos;
      }
      uVar19 = (ulong)uVar17;
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = pDVar12;
      if (local_dc < uVar21) {
LAB_0019f550:
        bVar8 = false;
        goto LAB_0019f552;
      }
      pvVar16 = (this->base_stack_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar19;
      levels = (this->levels_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar19;
      local_40 = uVar19;
      uVar9 = GetAxis(this,uVar21,levels,uVar9);
      uVar20 = (ulong)uVar9;
      if (this->dimension_ <= uVar9) goto LAB_0019f550;
      uVar3 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar20];
      local_c0 = uVar19;
      local_b8 = uVar20;
      if (this->bit_length_ == uVar3) {
        for (; uVar21 != 0; uVar21 = uVar21 - 1) {
          puVar10 = (ulong *)(pvVar16->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start;
          local_e8._0_8_ = *puVar10;
          local_e8.stack_pos = (uint32_t)puVar10[1];
          std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
          ::emplace_back<draco::VectorD<unsigned_int,3>>
                    ((vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                      *)(local_b0->oit_).container,(VectorD<unsigned_int,_3> *)&local_e8);
          this->num_decoded_points_ = this->num_decoded_points_ + 1;
        }
      }
      else {
        if (2 < uVar21) {
          if (this->num_decoded_points_ <= this->num_points_) {
            local_d8 = CONCAT44(local_d8._4_4_,this->bit_length_);
            uVar19 = (ulong)(uVar17 + 1);
            local_50 = uVar19;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((this->base_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar19,pvVar16);
            piVar2 = (int *)(*(long *)&(this->base_stack_).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + local_b8 * 4);
            *piVar2 = *piVar2 + (1 << ((char)local_d8 + ~(byte)uVar3 & 0x1f));
            uVar17 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> uVar17 == 0; uVar17 = uVar17 - 1) {
              }
            }
            uVar20 = (ulong)uVar17;
            uVar17 = 0;
            this_00 = local_48;
            local_d8 = uVar19 * 3;
            do {
              bVar8 = RAnsBitDecoder::DecodeNextBit(this_00);
              uVar17 = (uint)bVar8 + uVar17 * 2;
              this_00 = this_00 + 1;
              uVar20 = uVar20 - 1;
            } while (uVar20 != 0);
            iVar18 = (uVar21 >> 1) - uVar17;
            if (uVar17 <= uVar21 >> 1) {
              iVar22 = uVar21 - iVar18;
              iVar15 = iVar18;
              if ((iVar18 != iVar22) &&
                 (puVar1 = (this->half_decoder_).pos_._M_current, iVar15 = iVar22,
                 puVar1 != (this->half_decoder_).bits_.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish)) {
                uVar3 = (this->half_decoder_).num_used_bits_;
                uVar21 = *puVar1;
                uVar11 = uVar3 + 1;
                (this->half_decoder_).num_used_bits_ = uVar11;
                if (uVar11 == 0x20) {
                  (this->half_decoder_).pos_._M_current = puVar1 + 1;
                  (this->half_decoder_).num_used_bits_ = 0;
                }
                if ((0x80000000U >> ((byte)uVar3 & 0x1f) & uVar21) != 0) {
                  iVar15 = iVar18;
                  iVar18 = iVar22;
                }
              }
              pvVar4 = (this->levels_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar16 = pvVar4 + local_40;
              puVar14 = (pvVar16->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start + local_b8;
              *puVar14 = *puVar14 + 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)&(pvVar4->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + local_d8 * 8),pvVar16);
              if (iVar15 != 0) {
                local_e8.last_axis = uVar9;
                local_e8.num_remaining_points = iVar15;
                local_e8.stack_pos = (uint32_t)local_c0;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                            *)&local_a8,&local_e8);
              }
              if (iVar18 != 0) {
                local_e8.last_axis = uVar9;
                local_e8.num_remaining_points = iVar18;
                local_e8.stack_pos = (uint32_t)local_50;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                            *)&local_a8,&local_e8);
              }
              goto LAB_0019f53c;
            }
          }
          goto LAB_0019f550;
        }
        puVar7 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *puVar7 = uVar9;
        uVar19 = (ulong)this->dimension_;
        if (1 < this->dimension_) {
          uVar13 = 1;
          do {
            uVar17 = (int)uVar20 + 1;
            if ((int)uVar20 == (int)uVar19 + -1) {
              uVar17 = 0;
            }
            puVar7[uVar13] = uVar17;
            uVar13 = uVar13 + 1;
            uVar19 = (ulong)this->dimension_;
            uVar20 = (ulong)uVar17;
          } while (uVar13 < uVar19);
        }
        if (uVar21 != 0) {
          uVar17 = 0;
          do {
            puVar10 = (ulong *)(this->p_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
            if (this->dimension_ != 0) {
              puVar14 = (this->axes_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar19 = 0;
              do {
                *(uint *)((long)puVar10 + (ulong)puVar14[uVar19] * 4) = 0;
                uVar20 = (ulong)puVar14[uVar19];
                iVar18 = this->bit_length_ -
                         (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar20];
                if (iVar18 != 0) {
                  bVar8 = DirectBitDecoder::DecodeLeastSignificantBits32
                                    (local_38,iVar18,(uint32_t *)((long)puVar10 + uVar20 * 4));
                  if (!bVar8) goto LAB_0019f550;
                  puVar10 = (ulong *)(this->p_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                  puVar14 = (this->axes_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar20 = (ulong)puVar14[uVar19];
                }
                puVar1 = (uint *)((long)puVar10 + uVar20 * 4);
                *puVar1 = *puVar1 | (pvVar16->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start[uVar20];
                uVar19 = uVar19 + 1;
              } while (uVar19 < this->dimension_);
            }
            local_e8._0_8_ = *puVar10;
            local_e8.stack_pos = (uint32_t)puVar10[1];
            std::
            vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>::
            emplace_back<draco::VectorD<unsigned_int,3>>
                      ((vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                        *)(local_b0->oit_).container,(VectorD<unsigned_int,_3> *)&local_e8);
            this->num_decoded_points_ = this->num_decoded_points_ + 1;
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar21);
        }
      }
LAB_0019f53c:
    } while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
    bVar8 = true;
  }
LAB_0019f552:
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
  ::~_Deque_base(&local_a8);
  return bVar8;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}